

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O2

void __thiscall Node::AddList(Node *this,string *name,string *value)

{
  shared_ptr<Node> list_node;
  allocator local_79;
  undefined1 local_78 [32];
  string local_58;
  string local_38;
  
  local_79 = (allocator)0x1;
  std::make_shared<Node,std::__cxx11::string&,bool>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
             (bool *)name);
  std::__cxx11::string::string((string *)&local_38,"List",&local_79);
  std::__cxx11::string::string((string *)&local_58,(string *)value);
  AddAttribute((Node *)local_78._0_8_,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)(local_78 + 0x10),
             (__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)local_78);
  AddChild(this,(shared_ptr<Node> *)(local_78 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  return;
}

Assistant:

void Node::AddList(std::string name, std::string value) {
    std::shared_ptr<Node> list_node = std::make_shared<Node>(name, true);
    list_node->AddAttribute("List", value);
    this->AddChild(list_node);
}